

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFloatingArgs
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  pointer pAVar1;
  Token *pTVar2;
  const_reference __x;
  Token *token;
  size_t i;
  ConfigData *config_local;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  CommandLine<Catch::ConfigData> *this_local;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *unusedTokens;
  
  pAVar1 = std::
           unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::get(&this->m_floatingArg);
  if (pAVar1 == (pointer)0x0) {
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
              (__return_storage_ptr__,tokens);
  }
  else {
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
              (__return_storage_ptr__);
    for (token = (Token *)0x0;
        pTVar2 = (Token *)std::
                          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                          ::size(tokens), token < pTVar2; token = (Token *)((long)&token->type + 1))
    {
      __x = std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
            operator[](tokens,(size_type)token);
      if (__x->type == Positional) {
        pAVar1 = std::
                 unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                 ::operator->(&this->m_floatingArg);
        Detail::BoundArgFunction<Catch::ConfigData>::set
                  ((BoundArgFunction<Catch::ConfigData> *)pAVar1,config,&__x->data);
      }
      else {
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        push_back(__return_storage_ptr__,__x);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateFloatingArgs(std::vector<Parser::Token> const& tokens, ConfigT& config) const {
			if (!m_floatingArg.get())
				return tokens;
			std::vector<Parser::Token> unusedTokens;
			for (std::size_t i = 0; i < tokens.size(); ++i) {
				Parser::Token const& token = tokens[i];
				if (token.type == Parser::Token::Positional)
					m_floatingArg->boundField.set(config, token.data);
				else
					unusedTokens.push_back(token);
			}
			return unusedTokens;
		}